

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase785::run(TestCase785 *this)

{
  undefined1 auVar1 [8];
  undefined4 uVar2;
  None *pNVar3;
  char *pcVar4;
  size_t sVar5;
  ReadableFile *pRVar6;
  String *pSVar7;
  bool bVar8;
  int iVar9;
  InMemoryFileFactory *fileFactory;
  NullableValue<int> NVar10;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text;
  DebugComparison<long_&,_int> _kjCondition;
  Fault f;
  Own<const_kj::ReadableFile,_std::nullptr_t> file2;
  Own<const_kj::File,_std::nullptr_t> file;
  Own<kj::Directory,_std::nullptr_t> dir;
  ssize_t n;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  TestClock clock;
  undefined1 local_118 [8];
  None *pNStack_110;
  ArrayDisposer *local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  bool local_e0;
  String local_d8;
  char *local_b0;
  FsNode local_a0;
  ReadableFile *local_98;
  FsNode local_90;
  ReadableFile *local_88;
  undefined8 *local_80;
  String *local_78;
  ssize_t local_70;
  undefined1 local_68 [8];
  char *local_60;
  char *local_58;
  size_t local_50;
  bool local_48;
  Clock local_40;
  undefined8 local_38;
  
  local_40._vptr_Clock = (_func_int **)&PTR_now_00611890;
  local_38 = 1000000000;
  fileFactory = memfdInMemoryFileFactory();
  newInMemoryDirectory((kj *)&local_80,&local_40,fileFactory);
  pSVar7 = local_78;
  local_118 = (undefined1  [8])((long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27);
  pNStack_110 = (None *)&DAT_00000004;
  local_108 = (ArrayDisposer *)0x4b858f;
  local_100 = &DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)local_118;
  Path::Path((Path *)&local_d8,parts);
  path.parts.size_ = (size_t)local_d8.content.ptr;
  path.parts.ptr = pSVar7;
  Directory::openFile((Directory *)&local_90,path,(WriteMode)local_d8.content.size_);
  sVar5 = local_d8.content.size_;
  pcVar4 = local_d8.content.ptr;
  if ((NullableValue<int>)local_d8.content.ptr != (NullableValue<int>)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar4,0x18,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(local_88->super_FsNode)._vptr_FsNode)(local_118);
  if ((bool)local_118[0] != true) {
    local_d8.content.ptr = (char *)0x0;
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  }
  uVar2 = local_118._4_4_;
  do {
    local_70 = ::write(uVar2,"foo",3);
    if (-1 < local_70) goto LAB_002a6bba;
    iVar9 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar9 == -1);
  if (iVar9 != 0) {
    local_d8.content.ptr = (char *)0x0;
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  }
LAB_002a6bba:
  local_118 = (undefined1  [8])&local_70;
  pNStack_110 = (None *)CONCAT44(pNStack_110._4_4_,3);
  local_108 = (ArrayDisposer *)0x48a289;
  local_100 = &DAT_00000005;
  local_f8 = CONCAT71(local_f8._1_7_,local_70 == 3);
  if ((local_70 != 3) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[24],kj::_::DebugComparison<long&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x31d,ERROR,"\"failed: expected \" \"n == 3\", _kjCondition",
               (char (*) [24])"failed: expected n == 3",(DebugComparison<long_&,_int> *)local_118);
  }
  ReadableFile::readAllText(&local_d8,local_88);
  pNStack_110 = (None *)local_d8.content.size_;
  local_118 = (undefined1  [8])local_d8.content.ptr;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  if (pNStack_110 == (None *)&DAT_00000004) {
    local_e0 = *(int *)local_118 == 0x6f6f66;
  }
  else {
    local_e0 = false;
  }
  local_108 = local_d8.content.disposer;
  local_100 = "foo";
  local_f8 = 4;
  local_f0 = " == ";
  local_e8 = 5;
  NVar10 = (NullableValue<int>)local_118;
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,799,ERROR,
               "\"failed: expected \" \"file->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
               (char (*) [49])"failed: expected file->readAllText() == \"foo\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)local_118);
    NVar10 = (NullableValue<int>)local_118;
  }
  pNVar3 = pNStack_110;
  if (NVar10 != (NullableValue<int>)0x0) {
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    (**local_108->_vptr_ArrayDisposer)(local_108,NVar10,1,pNVar3,pNVar3,0);
  }
  pSVar7 = local_78;
  local_118 = (undefined1  [8])((long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27);
  pNStack_110 = (None *)&DAT_00000004;
  local_108 = (ArrayDisposer *)0x4b858f;
  local_100 = &DAT_00000004;
  parts_00.size_ = 2;
  parts_00.ptr = (StringPtr *)local_118;
  Path::Path((Path *)&local_d8,parts_00);
  path_00.parts.size_ = (size_t)local_d8.content.ptr;
  path_00.parts.ptr = pSVar7;
  ReadableDirectory::openFile((ReadableDirectory *)&local_a0,path_00);
  sVar5 = local_d8.content.size_;
  pcVar4 = local_d8.content.ptr;
  if ((NullableValue<int>)local_d8.content.ptr != (NullableValue<int>)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar4,0x18,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  ReadableFile::readAllText(&local_d8,local_98);
  pNStack_110 = (None *)local_d8.content.size_;
  local_118 = (undefined1  [8])local_d8.content.ptr;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  if (pNStack_110 == (None *)&DAT_00000004) {
    local_e0 = *(int *)local_118 == 0x6f6f66;
  }
  else {
    local_e0 = false;
  }
  local_108 = local_d8.content.disposer;
  local_100 = "foo";
  local_f8 = 4;
  local_f0 = " == ";
  local_e8 = 5;
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"file2->readAllText() == \\\"foo\\\"_kj\", _kjCondition",
               (char (*) [50])"failed: expected file2->readAllText() == \"foo\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)local_118);
  }
  pNVar3 = pNStack_110;
  auVar1 = local_118;
  if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    (**local_108->_vptr_ArrayDisposer)(local_108,auVar1,1,pNVar3,pNVar3,0);
  }
  text.content.size_ = 4;
  text.content.ptr = "bar";
  File::writeAll((File *)local_88,text);
  ReadableFile::readAllText(&local_d8,local_98);
  pNStack_110 = (None *)local_d8.content.size_;
  local_118 = (undefined1  [8])local_d8.content.ptr;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  if (pNStack_110 == (None *)&DAT_00000004) {
    local_e0 = *(int *)local_118 == 0x726162;
  }
  else {
    local_e0 = false;
  }
  local_108 = local_d8.content.disposer;
  local_100 = "bar";
  local_f8 = 4;
  local_f0 = " == ";
  local_e8 = 5;
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::String,kj::StringPtr>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x325,ERROR,
               "\"failed: expected \" \"file2->readAllText() == \\\"bar\\\"_kj\", _kjCondition",
               (char (*) [50])"failed: expected file2->readAllText() == \"bar\"_kj",
               (DebugComparison<kj::String,_kj::StringPtr> *)local_118);
  }
  pNVar3 = pNStack_110;
  auVar1 = local_118;
  if ((NullableValue<int>)local_118 != (NullableValue<int>)0x0) {
    local_118[0] = false;
    local_118._1_3_ = 0;
    local_118._4_4_ = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    pNStack_110 = (None *)0x0;
    (**local_108->_vptr_ArrayDisposer)(local_108,auVar1,1,pNVar3,pNVar3,0);
  }
  (**(local_98->super_FsNode)._vptr_FsNode)(&local_d8);
  if (local_d8.content.ptr._0_1_ != true) {
    local_118[0] = local_d8.content.ptr._0_1_;
    pNStack_110 = (None *)&none;
    local_108 = (ArrayDisposer *)0x48a0cc;
    local_100 = &DAT_00000005;
    local_f8 = CONCAT71(local_f8._1_7_,local_d8.content.ptr._0_1_);
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x326,ERROR,"\"failed: expected \" \"file2->getFd() != kj::none\", _kjCondition",
                 (char (*) [44])"failed: expected file2->getFd() != kj::none",
                 (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_118);
    }
  }
  (*(local_88->super_FsNode)._vptr_FsNode[2])(local_118);
  pcVar4 = local_f0;
  (*(local_98->super_FsNode)._vptr_FsNode[2])(&local_d8);
  local_68 = (undefined1  [8])pcVar4;
  local_60 = local_b0;
  local_58 = " == ";
  local_50 = 5;
  local_48 = pcVar4 == local_b0;
  if ((!local_48) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65],kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x327,ERROR,
               "\"failed: expected \" \"file->stat().hashCode == file2->stat().hashCode\", _kjCondition"
               ,(char (*) [65])"failed: expected file->stat().hashCode == file2->stat().hashCode",
               (DebugComparison<unsigned_long,_unsigned_long> *)local_68);
  }
  (**(code **)((local_78->content).ptr + 0x78))(&local_d8);
  (*(code *)**(undefined8 **)local_d8.content.size_)(local_68);
  sVar5 = local_d8.content.size_;
  bVar8 = local_68[0];
  if (local_68[0] == true) {
    uVar2 = local_68._4_4_;
    local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
    local_118._4_4_ = uVar2;
  }
  local_118[0] = bVar8;
  pNStack_110 = (None *)&none;
  local_108 = (ArrayDisposer *)0x48a0cc;
  local_100 = &DAT_00000005;
  local_f8 = CONCAT71(local_f8._1_7_,bVar8);
  if ((long *)local_d8.content.size_ != (long *)0x0) {
    local_d8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_d8.content.ptr)
              (local_d8.content.ptr,sVar5 + *(long *)(*(long *)sVar5 + -0x10));
  }
  if ((bVar8 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x329,ERROR,
               "\"failed: expected \" \"dir->createTemporary()->getFd() != kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected dir->createTemporary()->getFd() != kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_118);
  }
  pRVar6 = local_98;
  if (local_98 != (ReadableFile *)0x0) {
    local_98 = (ReadableFile *)0x0;
    (**(code **)*local_a0._vptr_FsNode)
              (local_a0._vptr_FsNode,
               (pRVar6->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar6->super_FsNode);
  }
  pRVar6 = local_88;
  if (local_88 != (ReadableFile *)0x0) {
    local_88 = (ReadableFile *)0x0;
    (**(code **)*local_90._vptr_FsNode)
              (local_90._vptr_FsNode,
               (pRVar6->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar6->super_FsNode);
  }
  pSVar7 = local_78;
  if (local_78 != (String *)0x0) {
    local_78 = (String *)0x0;
    (**(code **)*local_80)
              (local_80,(long)&(pSVar7->content).ptr + *(long *)((pSVar7->content).ptr + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }